

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemiterator_unix.cpp
# Opt level: O1

void __thiscall QFileSystemIterator::~QFileSystemIterator(QFileSystemIterator *this)

{
  DIR *__dirp;
  Data *pDVar1;
  
  QStringConverterBase::State::clear(&(this->toUtf16).super_QStringConverter.state);
  __dirp = (DIR *)(this->dir)._M_t.
                  super___uniq_ptr_impl<__dirstream,_QFileSystemIterator::DirStreamCloser>._M_t.
                  super__Tuple_impl<0UL,___dirstream_*,_QFileSystemIterator::DirStreamCloser>.
                  super__Head_base<0UL,___dirstream_*,_false>._M_head_impl;
  if (__dirp != (DIR *)0x0) {
    closedir(__dirp);
  }
  (this->dir)._M_t.super___uniq_ptr_impl<__dirstream,_QFileSystemIterator::DirStreamCloser>._M_t.
  super__Tuple_impl<0UL,___dirstream_*,_QFileSystemIterator::DirStreamCloser>.
  super__Head_base<0UL,___dirstream_*,_false>._M_head_impl = (__dirstream *)0x0;
  pDVar1 = (this->dirPath).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate(&((this->dirPath).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QFileSystemIterator::~QFileSystemIterator() = default;